

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getmodel.cpp
# Opt level: O2

void __thiscall getmodel::doCdfInnerNoIntensityUncertaintyz(getmodel *this,FILE *fin,int event_id)

{
  map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_> *this_00;
  long lVar1;
  pointer puVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  int iVar8;
  AREAPERIL_INT *areaperil_id;
  bool bVar9;
  int event_id_local;
  AREAPERIL_INT local_3c;
  uLong dest_length;
  
  this_00 = &this->_event_index_by_event_id;
  event_id_local = event_id;
  sVar5 = std::
          map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>::
          count(this_00,&event_id_local);
  if (sVar5 != 0) {
    pmVar6 = std::
             map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
             ::operator[](this_00,&event_id_local);
    fseek((FILE *)fin,pmVar6->offset,0);
    pmVar6 = std::
             map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
             ::operator[](this_00,&event_id_local);
    lVar1 = pmVar6->size;
    iVar8 = (int)lVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_compressed_buf,(long)(iVar8 + 1));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_uncompressed_buf,lVar1 * 0x1400000000 >> 0x20);
    fread((this->_compressed_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start,(long)iVar8,1,(FILE *)fin);
    puVar2 = (this->_uncompressed_buf).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    dest_length = (long)(this->_uncompressed_buf).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2;
    uVar3 = uncompress(puVar2,&dest_length,
                       (this->_compressed_buf).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,(long)iVar8);
    if (uVar3 != 0) {
      fprintf(_stderr,"FATAL: Got bad return code from uncompress %d\n",(ulong)uVar3);
      exit(-1);
    }
    areaperil_id = (AREAPERIL_INT *)
                   (this->_uncompressed_buf).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    iVar4 = (int)(dest_length / 0xc);
    iVar8 = 0;
    if (0 < iVar4) {
      iVar8 = iVar4;
    }
    while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
      local_3c = *areaperil_id;
      sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&this->_area_perils,(key_type *)&local_3c);
      if (sVar7 == 1) {
        doResultsNoIntensityUncertainty
                  (this,&event_id_local,areaperil_id,&this->_vulnerability_ids_by_area_peril,
                   &this->_vulnerabilities,areaperil_id[1]);
      }
      areaperil_id = areaperil_id + 3;
    }
  }
  return;
}

Assistant:

void getmodel::doCdfInnerNoIntensityUncertaintyz(FILE* fin, int event_id) {
  auto sizeof_EventKey = sizeof(EventRow);
  if (_event_index_by_event_id.count(event_id) == 0)
    return;
  flseek(fin, _event_index_by_event_id[event_id].offset, 0);
  int size = _event_index_by_event_id[event_id].size;
  _compressed_buf.resize(size + 1);
  _uncompressed_buf.resize(size * 20);
  fread(&_compressed_buf[0], size, 1, fin);
  uLong dest_length = _uncompressed_buf.size();
  int ret = uncompress(&_uncompressed_buf[0], &dest_length,
                        &_compressed_buf[0], size);
  if (ret != Z_OK) {
    fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
    exit(-1);
  }    
  // we now have the data length
  int number_of_event_records =
      static_cast<int>(dest_length / sizeof_EventKey);
  EventRow *event_key = (EventRow *)&_uncompressed_buf[0];
  for (int i = 0; i < number_of_event_records; i++) {
    bool do_cdf_for_area_peril =
        (_area_perils.count(event_key->areaperil_id) == 1);
    if (do_cdf_for_area_peril) {
      // Generate and write the results
      doResultsNoIntensityUncertainty(
          event_id, event_key->areaperil_id, _vulnerability_ids_by_area_peril,
          _vulnerabilities, event_key->intensity_bin_id);
    }
    event_key++;
  }
}